

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O1

void __thiscall argparse::args_t::~args_t(args_t *this)

{
  FILE *pFVar1;
  
  pFVar1 = (FILE *)this->output;
  if ((pFVar1 != (FILE *)0x0) && (pFVar1 != _stdout)) {
    fclose(pFVar1);
  }
  pFVar1 = (FILE *)this->input_add;
  if ((pFVar1 != (FILE *)0x0) && (pFVar1 != _stdin)) {
    fclose(pFVar1);
  }
  if ((FILE *)this->input_master != (FILE *)0x0) {
    fclose((FILE *)this->input_master);
    return;
  }
  return;
}

Assistant:

args_t::~args_t() {
        if ( output && output != stdout )
            fclose( output );
        
        if ( input_add && input_add != stdin)
            fclose (input_add);
        
        if ( input_master )
            fclose (input_master);
        
    }